

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS ref_face_with(REF_FACE ref_face,REF_INT *nodes,REF_INT *face)

{
  uint uVar1;
  REF_INT local_7c;
  REF_INT local_78;
  int local_74;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT orig [4];
  REF_INT candidate [4];
  REF_INT target [4];
  REF_INT local_30;
  REF_INT node;
  REF_INT ref;
  REF_INT item;
  REF_INT *face_local;
  REF_INT *nodes_local;
  REF_FACE ref_face_local;
  
  *face = -1;
  ref_face_local._4_4_ = ref_face_make_canonical(nodes,candidate + 2);
  if (ref_face_local._4_4_ == 0) {
    if ((*nodes < 0) || (ref_face->adj->nnode <= *nodes)) {
      local_74 = -1;
    }
    else {
      local_74 = ref_face->adj->first[*nodes];
    }
    node = local_74;
    if (local_74 == -1) {
      local_78 = -1;
    }
    else {
      local_78 = ref_face->adj->item[local_74].ref;
    }
    local_30 = local_78;
    while (node != -1) {
      for (target[3] = 0; target[3] < 4; target[3] = target[3] + 1) {
        (&ref_private_macro_code_rss_1)[target[3]] = ref_face->f2n[target[3] + local_30 * 4];
      }
      uVar1 = ref_face_make_canonical(&ref_private_macro_code_rss_1,orig + 2);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x8e
               ,"ref_face_with",(ulong)uVar1,"canonical");
        return uVar1;
      }
      if ((((candidate[2] == orig[2]) && (candidate[3] == orig[3])) && (target[0] == candidate[0]))
         && (target[1] == candidate[1])) {
        *face = local_30;
        return 0;
      }
      node = ref_face->adj->item[node].next;
      if (node == -1) {
        local_7c = -1;
      }
      else {
        local_7c = ref_face->adj->item[node].ref;
      }
      local_30 = local_7c;
    }
    ref_face_local._4_4_ = 5;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x89,
           "ref_face_with",(ulong)ref_face_local._4_4_,"canonical");
  }
  return ref_face_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_face_with(REF_FACE ref_face, REF_INT *nodes,
                                 REF_INT *face) {
  REF_INT item, ref, node;
  REF_INT target[4], candidate[4], orig[4];

  (*face) = REF_EMPTY;

  RSS(ref_face_make_canonical(nodes, target), "canonical");

  each_ref_adj_node_item_with_ref(ref_face_adj(ref_face), nodes[0], item, ref) {
    for (node = 0; node < 4; node++)
      orig[node] = ref_face_f2n(ref_face, node, ref);
    RSS(ref_face_make_canonical(orig, candidate), "canonical");
    if (target[0] == candidate[0] && target[1] == candidate[1] &&
        target[2] == candidate[2] && target[3] == candidate[3]) {
      (*face) = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}